

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall re2::RE2::ReverseProgramSize(RE2 *this)

{
  Prog *this_00;
  RE2 *in_RDI;
  Prog *prog;
  int local_4;
  
  if (in_RDI->prog_ == (Prog *)0x0) {
    local_4 = -1;
  }
  else {
    this_00 = ReverseProg(in_RDI);
    if (this_00 == (Prog *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = Prog::size(this_00);
    }
  }
  return local_4;
}

Assistant:

int RE2::ReverseProgramSize() const {
  if (prog_ == NULL)
    return -1;
  Prog* prog = ReverseProg();
  if (prog == NULL)
    return -1;
  return prog->size();
}